

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O3

timespec timespec_normalise(timespec ts)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  timespec tVar5;
  
  uVar3 = ts.tv_nsec;
  lVar4 = ts.tv_sec;
  if (999999999 < (long)uVar3) {
    lVar1 = 0;
    if (0x773593fe < uVar3) {
      lVar1 = uVar3 - 1999999999;
    }
    uVar2 = (lVar1 + 999999999U) / 1000000000;
    lVar4 = lVar4 + uVar2 + 1;
    uVar3 = (uVar3 - 1000000000) + uVar2 * -1000000000;
  }
  if ((long)uVar3 < -999999999) {
    uVar2 = 0xffffffff88ca6c01;
    if (0xffffffff88ca6c01 < uVar3) {
      uVar2 = uVar3;
    }
    uVar2 = ((uVar2 - uVar3) - (ulong)(uVar3 < 0xffffffff88ca6c01)) / 1000000000 +
            (ulong)(uVar3 < 0xffffffff88ca6c01);
    lVar4 = lVar4 + ~uVar2;
    uVar3 = uVar3 + 1000000000 + uVar2 * 1000000000;
  }
  uVar2 = uVar3 + 1000000000;
  if (-1 < (long)uVar3) {
    uVar2 = uVar3;
  }
  tVar5.tv_nsec = uVar2;
  tVar5.tv_sec = ((long)uVar3 >> 0x3f) + lVar4;
  return tVar5;
}

Assistant:

static struct timespec timespec_normalise(struct timespec ts)
{
	while (ts.tv_nsec >= NSEC_PER_SEC) {
		++(ts.tv_sec);
		ts.tv_nsec -= NSEC_PER_SEC;
	}

	while (ts.tv_nsec <= -NSEC_PER_SEC) {
		--(ts.tv_sec);
		ts.tv_nsec += NSEC_PER_SEC;
	}

	if (ts.tv_nsec < 0) {
		/*
		 * Negative nanoseconds isn't valid according to
		 * POSIX. Decrement tv_sec and roll tv_nsec over.
		 */

		--(ts.tv_sec);
		ts.tv_nsec = (NSEC_PER_SEC + ts.tv_nsec);
	}

	return ts;
}